

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall
duckdb::Connection::Append(Connection *this,TableDescription *description,DataChunk *chunk)

{
  type context;
  Allocator *allocator_p;
  ColumnDataCollection collection;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_b0;
  ColumnDataCollection local_98;
  
  if (chunk->count != 0) {
    context = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
    allocator_p = Allocator::Get(context);
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_b0,chunk);
    ColumnDataCollection::ColumnDataCollection
              (&local_98,allocator_p,(vector<duckdb::LogicalType,_true> *)&local_b0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_b0);
    ColumnDataCollection::Append(&local_98,chunk);
    Append(this,description,&local_98);
    ColumnDataCollection::~ColumnDataCollection(&local_98);
  }
  return;
}

Assistant:

void Connection::Append(TableDescription &description, DataChunk &chunk) {
	if (chunk.size() == 0) {
		return;
	}
	ColumnDataCollection collection(Allocator::Get(*context), chunk.GetTypes());
	collection.Append(chunk);
	Append(description, collection);
}